

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

array_container_t * array_container_from_run(run_container_t *arr)

{
  uint16_t uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint16_t *puVar4;
  int32_t iVar5;
  long lVar6;
  array_container_t *paVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  lVar6 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar6 + 4) & 0x20) == 0) {
    iVar9 = arr->n_runs;
    lVar6 = (long)iVar9;
    if (0 < lVar6) {
      lVar8 = 0;
      do {
        iVar9 = iVar9 + (uint)arr->runs[lVar8].length;
        lVar8 = lVar8 + 1;
      } while (lVar6 != lVar8);
    }
  }
  else {
    iVar9 = _avx2_run_container_cardinality(arr);
  }
  paVar7 = array_container_create_given_capacity(iVar9);
  paVar7->cardinality = 0;
  iVar9 = arr->n_runs;
  if (0 < (long)iVar9) {
    prVar3 = arr->runs;
    puVar4 = paVar7->array;
    lVar6 = 0;
    iVar5 = paVar7->cardinality;
    do {
      iVar11 = iVar5;
      uVar1 = prVar3[lVar6].value;
      uVar2 = prVar3[lVar6].length;
      lVar8 = 0;
      do {
        puVar4[iVar11 + lVar8] = uVar1 + (short)lVar8;
        lVar8 = lVar8 + 1;
        iVar10 = (int)lVar8;
      } while (uVar2 + 1 != iVar10);
      lVar6 = lVar6 + 1;
      iVar5 = iVar11 + iVar10;
    } while (lVar6 != iVar9);
    paVar7->cardinality = iVar11 + iVar10;
  }
  return paVar7;
}

Assistant:

array_container_t *array_container_from_run(const run_container_t *arr) {
    array_container_t *answer =
        array_container_create_given_capacity(run_container_cardinality(arr));
    answer->cardinality = 0;
    for (int rlepos = 0; rlepos < arr->n_runs; ++rlepos) {
        int run_start = arr->runs[rlepos].value;
        int run_end = run_start + arr->runs[rlepos].length;

        for (int run_value = run_start; run_value <= run_end; ++run_value) {
            answer->array[answer->cardinality++] = (uint16_t)run_value;
        }
    }
    return answer;
}